

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O0

void __thiscall Assimp::FBX::FBXConverter::TransferDataToScene(FBXConverter *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  size_type sVar7;
  ulong uVar8;
  aiMesh **__s;
  iterator __first1;
  iterator __last1;
  aiMaterial **__s_00;
  iterator __first1_00;
  iterator __last1_00;
  aiAnimation **__s_01;
  iterator __first1_01;
  iterator __last1_01;
  aiLight **__s_02;
  iterator __first1_02;
  iterator __last1_02;
  aiCamera **__s_03;
  iterator __first1_03;
  iterator __last1_03;
  aiTexture **__s_04;
  iterator __first1_04;
  iterator __last1_04;
  FBXConverter *this_local;
  
  if (this->out->mMeshes != (aiMesh **)0x0) {
    __assert_fail("!out->mMeshes",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/FBX/FBXConverter.cpp"
                  ,0xe3a,"void Assimp::FBX::FBXConverter::TransferDataToScene()");
  }
  if (this->out->mNumMeshes != 0) {
    __assert_fail("!out->mNumMeshes",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/FBX/FBXConverter.cpp"
                  ,0xe3b,"void Assimp::FBX::FBXConverter::TransferDataToScene()");
  }
  sVar7 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::size(&this->meshes);
  if (sVar7 != 0) {
    sVar7 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::size(&this->meshes);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = sVar7;
    uVar8 = SUB168(auVar1 * ZEXT816(8),0);
    if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
      uVar8 = 0xffffffffffffffff;
    }
    __s = (aiMesh **)operator_new__(uVar8);
    memset(__s,0,uVar8);
    this->out->mMeshes = __s;
    sVar7 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::size(&this->meshes);
    this->out->mNumMeshes = (uint)sVar7;
    __first1 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::begin(&this->meshes);
    __last1 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::end(&this->meshes);
    std::
    swap_ranges<__gnu_cxx::__normal_iterator<aiMesh**,std::vector<aiMesh*,std::allocator<aiMesh*>>>,aiMesh**>
              ((__normal_iterator<aiMesh_**,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>)
               __first1._M_current,
               (__normal_iterator<aiMesh_**,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>)
               __last1._M_current,this->out->mMeshes);
  }
  sVar7 = std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::size(&this->materials);
  if (sVar7 != 0) {
    sVar7 = std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::size(&this->materials);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = sVar7;
    uVar8 = SUB168(auVar2 * ZEXT816(8),0);
    if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
      uVar8 = 0xffffffffffffffff;
    }
    __s_00 = (aiMaterial **)operator_new__(uVar8);
    memset(__s_00,0,uVar8);
    this->out->mMaterials = __s_00;
    sVar7 = std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::size(&this->materials);
    this->out->mNumMaterials = (uint)sVar7;
    __first1_00 = std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::begin(&this->materials);
    __last1_00 = std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::end(&this->materials);
    std::
    swap_ranges<__gnu_cxx::__normal_iterator<aiMaterial**,std::vector<aiMaterial*,std::allocator<aiMaterial*>>>,aiMaterial**>
              ((__normal_iterator<aiMaterial_**,_std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>_>
                )__first1_00._M_current,
               (__normal_iterator<aiMaterial_**,_std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>_>
                )__last1_00._M_current,this->out->mMaterials);
  }
  sVar7 = std::vector<aiAnimation_*,_std::allocator<aiAnimation_*>_>::size(&this->animations);
  if (sVar7 != 0) {
    sVar7 = std::vector<aiAnimation_*,_std::allocator<aiAnimation_*>_>::size(&this->animations);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = sVar7;
    uVar8 = SUB168(auVar3 * ZEXT816(8),0);
    if (SUB168(auVar3 * ZEXT816(8),8) != 0) {
      uVar8 = 0xffffffffffffffff;
    }
    __s_01 = (aiAnimation **)operator_new__(uVar8);
    memset(__s_01,0,uVar8);
    this->out->mAnimations = __s_01;
    sVar7 = std::vector<aiAnimation_*,_std::allocator<aiAnimation_*>_>::size(&this->animations);
    this->out->mNumAnimations = (uint)sVar7;
    __first1_01 = std::vector<aiAnimation_*,_std::allocator<aiAnimation_*>_>::begin
                            (&this->animations);
    __last1_01 = std::vector<aiAnimation_*,_std::allocator<aiAnimation_*>_>::end(&this->animations);
    std::
    swap_ranges<__gnu_cxx::__normal_iterator<aiAnimation**,std::vector<aiAnimation*,std::allocator<aiAnimation*>>>,aiAnimation**>
              ((__normal_iterator<aiAnimation_**,_std::vector<aiAnimation_*,_std::allocator<aiAnimation_*>_>_>
                )__first1_01._M_current,
               (__normal_iterator<aiAnimation_**,_std::vector<aiAnimation_*,_std::allocator<aiAnimation_*>_>_>
                )__last1_01._M_current,this->out->mAnimations);
  }
  sVar7 = std::vector<aiLight_*,_std::allocator<aiLight_*>_>::size(&this->lights);
  if (sVar7 != 0) {
    sVar7 = std::vector<aiLight_*,_std::allocator<aiLight_*>_>::size(&this->lights);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = sVar7;
    uVar8 = SUB168(auVar4 * ZEXT816(8),0);
    if (SUB168(auVar4 * ZEXT816(8),8) != 0) {
      uVar8 = 0xffffffffffffffff;
    }
    __s_02 = (aiLight **)operator_new__(uVar8);
    memset(__s_02,0,uVar8);
    this->out->mLights = __s_02;
    sVar7 = std::vector<aiLight_*,_std::allocator<aiLight_*>_>::size(&this->lights);
    this->out->mNumLights = (uint)sVar7;
    __first1_02 = std::vector<aiLight_*,_std::allocator<aiLight_*>_>::begin(&this->lights);
    __last1_02 = std::vector<aiLight_*,_std::allocator<aiLight_*>_>::end(&this->lights);
    std::
    swap_ranges<__gnu_cxx::__normal_iterator<aiLight**,std::vector<aiLight*,std::allocator<aiLight*>>>,aiLight**>
              ((__normal_iterator<aiLight_**,_std::vector<aiLight_*,_std::allocator<aiLight_*>_>_>)
               __first1_02._M_current,
               (__normal_iterator<aiLight_**,_std::vector<aiLight_*,_std::allocator<aiLight_*>_>_>)
               __last1_02._M_current,this->out->mLights);
  }
  sVar7 = std::vector<aiCamera_*,_std::allocator<aiCamera_*>_>::size(&this->cameras);
  if (sVar7 != 0) {
    sVar7 = std::vector<aiCamera_*,_std::allocator<aiCamera_*>_>::size(&this->cameras);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = sVar7;
    uVar8 = SUB168(auVar5 * ZEXT816(8),0);
    if (SUB168(auVar5 * ZEXT816(8),8) != 0) {
      uVar8 = 0xffffffffffffffff;
    }
    __s_03 = (aiCamera **)operator_new__(uVar8);
    memset(__s_03,0,uVar8);
    this->out->mCameras = __s_03;
    sVar7 = std::vector<aiCamera_*,_std::allocator<aiCamera_*>_>::size(&this->cameras);
    this->out->mNumCameras = (uint)sVar7;
    __first1_03 = std::vector<aiCamera_*,_std::allocator<aiCamera_*>_>::begin(&this->cameras);
    __last1_03 = std::vector<aiCamera_*,_std::allocator<aiCamera_*>_>::end(&this->cameras);
    std::
    swap_ranges<__gnu_cxx::__normal_iterator<aiCamera**,std::vector<aiCamera*,std::allocator<aiCamera*>>>,aiCamera**>
              ((__normal_iterator<aiCamera_**,_std::vector<aiCamera_*,_std::allocator<aiCamera_*>_>_>
                )__first1_03._M_current,
               (__normal_iterator<aiCamera_**,_std::vector<aiCamera_*,_std::allocator<aiCamera_*>_>_>
                )__last1_03._M_current,this->out->mCameras);
  }
  sVar7 = std::vector<aiTexture_*,_std::allocator<aiTexture_*>_>::size(&this->textures);
  if (sVar7 != 0) {
    sVar7 = std::vector<aiTexture_*,_std::allocator<aiTexture_*>_>::size(&this->textures);
    auVar6._8_8_ = 0;
    auVar6._0_8_ = sVar7;
    uVar8 = SUB168(auVar6 * ZEXT816(8),0);
    if (SUB168(auVar6 * ZEXT816(8),8) != 0) {
      uVar8 = 0xffffffffffffffff;
    }
    __s_04 = (aiTexture **)operator_new__(uVar8);
    memset(__s_04,0,uVar8);
    this->out->mTextures = __s_04;
    sVar7 = std::vector<aiTexture_*,_std::allocator<aiTexture_*>_>::size(&this->textures);
    this->out->mNumTextures = (uint)sVar7;
    __first1_04 = std::vector<aiTexture_*,_std::allocator<aiTexture_*>_>::begin(&this->textures);
    __last1_04 = std::vector<aiTexture_*,_std::allocator<aiTexture_*>_>::end(&this->textures);
    std::
    swap_ranges<__gnu_cxx::__normal_iterator<aiTexture**,std::vector<aiTexture*,std::allocator<aiTexture*>>>,aiTexture**>
              ((__normal_iterator<aiTexture_**,_std::vector<aiTexture_*,_std::allocator<aiTexture_*>_>_>
                )__first1_04._M_current,
               (__normal_iterator<aiTexture_**,_std::vector<aiTexture_*,_std::allocator<aiTexture_*>_>_>
                )__last1_04._M_current,this->out->mTextures);
  }
  return;
}

Assistant:

void FBXConverter::TransferDataToScene()
        {
            ai_assert(!out->mMeshes);
            ai_assert(!out->mNumMeshes);

            // note: the trailing () ensures initialization with nullptr - not
            // many C++ users seem to know this, so pointing it out to avoid
            // confusion why this code works.

            if (meshes.size()) {
                out->mMeshes = new aiMesh*[meshes.size()]();
                out->mNumMeshes = static_cast<unsigned int>(meshes.size());

                std::swap_ranges(meshes.begin(), meshes.end(), out->mMeshes);
            }

            if (materials.size()) {
                out->mMaterials = new aiMaterial*[materials.size()]();
                out->mNumMaterials = static_cast<unsigned int>(materials.size());

                std::swap_ranges(materials.begin(), materials.end(), out->mMaterials);
            }

            if (animations.size()) {
                out->mAnimations = new aiAnimation*[animations.size()]();
                out->mNumAnimations = static_cast<unsigned int>(animations.size());

                std::swap_ranges(animations.begin(), animations.end(), out->mAnimations);
            }

            if (lights.size()) {
                out->mLights = new aiLight*[lights.size()]();
                out->mNumLights = static_cast<unsigned int>(lights.size());

                std::swap_ranges(lights.begin(), lights.end(), out->mLights);
            }

            if (cameras.size()) {
                out->mCameras = new aiCamera*[cameras.size()]();
                out->mNumCameras = static_cast<unsigned int>(cameras.size());

                std::swap_ranges(cameras.begin(), cameras.end(), out->mCameras);
            }

            if (textures.size()) {
                out->mTextures = new aiTexture*[textures.size()]();
                out->mNumTextures = static_cast<unsigned int>(textures.size());

                std::swap_ranges(textures.begin(), textures.end(), out->mTextures);
            }
        }